

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::ktxTexture_calcLevelOffset_OffsetOfEachLevelD32_SFLOAT_S8_UINT_Test::
TestBody(ktxTexture_calcLevelOffset_OffsetOfEachLevelD32_SFLOAT_S8_UINT_Test *this)

{
  size_t sVar1;
  pointer *__ptr_4;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  uint *rhs;
  ulong uVar3;
  int *piVar4;
  ktx_size_t levelOffset;
  ktxTexture2 *ktx2texture;
  ktx_error_code_e result;
  ktx_uint32_t ktx2offsets [4];
  AssertHelper local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  AssertHelper local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  long local_88;
  ktx_error_code_e local_7c;
  uint local_78 [6];
  undefined8 local_60 [2];
  undefined8 local_50;
  undefined8 uStack_48;
  ulong local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  local_88 = 0;
  local_50 = 0x900000009;
  uStack_48 = 0x200000001;
  local_60[0] = 0x8200000000;
  local_34 = 0;
  local_38 = 1;
  local_40 = 0x100000004;
  local_78[0] = 0xa8;
  local_78[1] = 0x28;
  local_78[2] = 8;
  local_78[3] = 0;
  local_7c = ktxTexture2_Create(local_60,0);
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_c0._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_a8,"result","KTX_SUCCESS",&local_7c,(ktx_error_code_e *)&local_c0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x5b1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_c0._M_head_impl._0_1_ = local_88 != 0;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88 == 0) {
    testing::Message::Message((Message *)&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_c8.data_)->line,"ktxTexture2_Create failed: ",0x1b);
    pcVar2 = (char *)ktxErrorString(local_7c);
    piVar4 = &(local_c8.data_)->line;
    if (pcVar2 == (char *)0x0) {
      sVar1 = 6;
      pcVar2 = "(null)";
    }
    else {
      sVar1 = strlen(pcVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar4,pcVar2,sVar1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)&local_c0,(AssertionResult *)"ktx2texture != __null",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x5b2,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1);
    }
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  else {
    if ((int)local_40 != 0) {
      rhs = local_78;
      uVar3 = 0;
      do {
        local_c0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ktxTexture2_calcLevelOffset(local_88,uVar3 & 0xffffffff);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_a8,"levelOffset","ktx2offsets[i]",(unsigned_long *)&local_c0,
                   rhs);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c8);
          pcVar2 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar2 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x5b8,pcVar2);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        uVar3 = uVar3 + 1;
        rhs = rhs + 1;
      } while (uVar3 < (local_40 & 0xffffffff));
      if (local_88 == 0) {
        return;
      }
    }
    (*(code *)**(undefined8 **)(local_88 + 8))();
  }
  return;
}

Assistant:

TEST(ktxTexture_calcLevelOffset, OffsetOfEachLevelD32_SFLOAT_S8_UINT) {
    ktxTexture2* ktx2texture = 0;
    TestCreateInfo createInfo(9, 9, 1, 2, 0,
                              VK_FORMAT_D32_SFLOAT_S8_UINT, KTX_FALSE, 1, 1);
    KTX_error_code result;
    // Offsets for 9x9, 4 level  texture.
    // KTX 2: level 0 ... level 4 with mip padding to an 8 byte alignment.
    ktx_uint32_t ktx2offsets[] = {8+32+128, 8+32, 8, 0};

    result = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                &ktx2texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(ktx2texture != NULL) << "ktxTexture2_Create failed: "
                                 << ktxErrorString(result);

    for (ktx_uint32_t i = 0; i < createInfo.numLevels; i++) {
        ktx_size_t levelOffset;
        levelOffset = ktxTexture2_calcLevelOffset(ktx2texture, i);
        EXPECT_EQ(levelOffset, ktx2offsets[i]);
    }
    if (ktx2texture)
        ktxTexture_Destroy(ktxTexture(ktx2texture));
}